

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int modifyPagePointer(MemPage *pPage,Pgno iFrom,Pgno iTo,u8 eType)

{
  ushort uVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  undefined8 uVar3;
  ulong uVar4;
  uint *puVar5;
  u8 *puVar6;
  long in_FS_OFFSET;
  int local_64;
  undefined1 local_58 [20];
  ushort uStack_44;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000009,eType) == 4) {
    uVar2 = *(uint *)pPage->aData;
    if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) == iFrom)
    {
      *(Pgno *)pPage->aData =
           iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
LAB_00141456:
      local_64 = 0;
      goto LAB_00141629;
    }
    uVar3 = 0x1237d;
  }
  else {
    if ((pPage->isInit == '\0') && (local_64 = btreeInitPage(pPage), local_64 != 0))
    goto LAB_00141629;
    uVar1 = pPage->nCell;
    local_64 = 0;
    uVar4 = 0;
    if (uVar1 == 0) {
LAB_001415ce:
      if ((uint)uVar4 != (uint)uVar1) goto LAB_00141629;
    }
    else {
      uVar4 = 0;
      do {
        puVar5 = (uint *)(pPage->aData +
                         (CONCAT11(pPage->aCellIdx[uVar4 * 2],pPage->aCellIdx[uVar4 * 2 + 1]) &
                         pPage->maskPage));
        if (eType == '\x03') {
          stack0xffffffffffffffb8 = &DAT_aaaaaaaaaaaaaaaa;
          local_58._0_4_ = 0xaaaaaaaa;
          local_58._4_4_ = 0xaaaaaaaa;
          local_58._8_4_ = 0xaaaaaaaa;
          local_58._12_4_ = 0xaaaaaaaa;
          (*pPage->xParseCell)(pPage,(u8 *)puVar5,(CellInfo *)local_58);
          if ((uint)uStack_44 < (uint)local_58._16_4_) {
            puVar6 = (u8 *)((long)puVar5 + ((ulong)stack0xffffffffffffffb8 >> 0x30));
            if (pPage->aData + pPage->pBt->usableSize < puVar6) {
              uVar3 = 0x12390;
              goto LAB_00141622;
            }
            uVar2 = *(uint *)(puVar6 + -4);
            if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
                iFrom) {
              *(Pgno *)(puVar6 + -4) =
                   iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
              goto LAB_00141456;
            }
          }
        }
        else {
          if (pPage->aData + pPage->pBt->usableSize < puVar5 + 1) {
            uVar3 = 0x12399;
            goto LAB_00141622;
          }
          uVar2 = *puVar5;
          if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
              iFrom) {
            *puVar5 = iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
            goto LAB_001415ce;
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    if (eType == '\x05') {
      uVar2 = *(uint *)(pPage->aData + (ulong)pPage->hdrOffset + 8);
      if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) == iFrom
         ) {
        *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
             iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
        goto LAB_00141456;
      }
    }
    uVar3 = 0x123a5;
  }
LAB_00141622:
  local_64 = 0xb;
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar3,
              "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
LAB_00141629:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_64;
}

Assistant:

static int modifyPagePointer(MemPage *pPage, Pgno iFrom, Pgno iTo, u8 eType){
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( eType==PTRMAP_OVERFLOW2 ){
    /* The pointer is always the first 4 bytes of the page in this case.  */
    if( get4byte(pPage->aData)!=iFrom ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    put4byte(pPage->aData, iTo);
  }else{
    int i;
    int nCell;
    int rc;

    rc = pPage->isInit ? SQLITE_OK : btreeInitPage(pPage);
    if( rc ) return rc;
    nCell = pPage->nCell;

    for(i=0; i<nCell; i++){
      u8 *pCell = findCell(pPage, i);
      if( eType==PTRMAP_OVERFLOW1 ){
        CellInfo info;
        pPage->xParseCell(pPage, pCell, &info);
        if( info.nLocal<info.nPayload ){
          if( pCell+info.nSize > pPage->aData+pPage->pBt->usableSize ){
            return SQLITE_CORRUPT_PAGE(pPage);
          }
          if( iFrom==get4byte(pCell+info.nSize-4) ){
            put4byte(pCell+info.nSize-4, iTo);
            break;
          }
        }
      }else{
        if( pCell+4 > pPage->aData+pPage->pBt->usableSize ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( get4byte(pCell)==iFrom ){
          put4byte(pCell, iTo);
          break;
        }
      }
    }

    if( i==nCell ){
      if( eType!=PTRMAP_BTREE ||
          get4byte(&pPage->aData[pPage->hdrOffset+8])!=iFrom ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      put4byte(&pPage->aData[pPage->hdrOffset+8], iTo);
    }
  }
  return SQLITE_OK;
}